

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

Abc_Cex_t * Llb_CoreDeriveCex(Llb_Img_t *p)

{
  DdManager *pDVar1;
  DdManager *ddDestination;
  Vec_Ptr_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  char *string;
  DdNode *pDVar5;
  DdNode *n;
  int *Permute;
  DdNode *n_00;
  char *pValues;
  int nPiOffset;
  int RetValue;
  int v;
  int i;
  DdNode *bRing;
  DdNode *bTemp;
  DdNode *bOneCube;
  DdNode *bImage;
  DdNode *bState;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  Vec_Ptr_t *vSupps;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Llb_Img_t *p_local;
  
  bImage = (DdNode *)0x0;
  pCex = (Abc_Cex_t *)p;
  iVar2 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar2);
  iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  if (iVar2 < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x6a,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  *(undefined8 *)(*(long *)&pCex[1].iFrame + 0x2f0) = 0;
  *(undefined8 *)(*(long *)(pCex + 2) + 0x2f0) = 0;
  Vec_PtrReverseOrder(*(Vec_Ptr_t **)&pCex[2].nRegs);
  vQuant0 = Llb_ImgSupports(*(Aig_Man_t **)&pCex->nRegs,*(Vec_Ptr_t **)&pCex[2].nRegs,
                            *(Vec_Int_t **)(pCex + 4),*(Vec_Int_t **)&pCex[3].nPis,1,0);
  Llb_ImgSchedule(vQuant0,&vQuant1,(Vec_Ptr_t **)&bState,0);
  Vec_VecFree((Vec_Vec_t *)vQuant0);
  Llb_ImgQuantifyReset(*(Vec_Ptr_t **)&pCex[2].nRegs);
  iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs);
  iVar3 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs);
  iVar4 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  pObj = (Aig_Obj_t *)Abc_CexAlloc(iVar2,iVar3,iVar4);
  iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  *(int *)((long)&pObj->field_0 + 4) = iVar2 + -1;
  (pObj->field_0).CioId = -1;
  pDVar1 = *(DdManager **)(pCex + 2);
  pDVar5 = (DdNode *)Vec_PtrEntryLast(*(Vec_Ptr_t **)&pCex[2].nBits);
  pDVar5 = Cudd_bddIntersect(pDVar1,pDVar5,*(DdNode **)(*(long *)(pCex + 2) + 0x2e0));
  Cudd_Ref(pDVar5);
  iVar2 = Cudd_bddPickOneCube(*(DdManager **)(pCex + 2),pDVar5,string);
  Cudd_RecursiveDeref(*(DdManager **)(pCex + 2),pDVar5);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x80,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs);
  iVar3 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs);
  iVar4 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  pValues._0_4_ = iVar2 + iVar3 * (iVar4 + -1);
  for (RetValue = 0; iVar2 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs), RetValue < iVar2;
      RetValue = RetValue + 1) {
    vSupps = (Vec_Ptr_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)&pCex->nRegs + 0x10),RetValue);
    iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs);
    if (string[iVar2 + RetValue] == '\x01') {
      Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),(int)pValues + RetValue);
    }
  }
  iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  if (1 < iVar2) {
    bImage = Llb_CoreComputeCube(*(DdManager **)&pCex[1].iFrame,*(Vec_Int_t **)(pCex + 4),1,string);
    Cudd_Ref(bImage);
  }
  nPiOffset = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
LAB_00ab3f03:
  do {
    nPiOffset = nPiOffset + -1;
    if (nPiOffset < 0) goto LAB_00ab42d9;
    pDVar5 = (DdNode *)Vec_PtrEntry(*(Vec_Ptr_t **)&pCex[2].nBits,nPiOffset);
    iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)&pCex[2].nBits);
  } while (nPiOffset == iVar2 + -1);
  n = Llb_ImgComputeImage(*(Aig_Man_t **)&pCex->nRegs,*(Vec_Ptr_t **)&pCex[2].nRegs,
                          *(DdManager **)&pCex[1].iFrame,bImage,vQuant1,(Vec_Ptr_t *)bState,
                          *(Vec_Int_t **)&pCex[3].iFrame,*(abctime *)(*(long *)&pCex->nBits + 0x60),
                          1,0,0);
  if (n == (DdNode *)0x0) {
    __assert_fail("bImage != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x95,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  Cudd_Ref(n);
  Cudd_RecursiveDeref(*(DdManager **)&pCex[1].iFrame,bImage);
  pDVar1 = *(DdManager **)&pCex[1].iFrame;
  ddDestination = *(DdManager **)(pCex + 2);
  Permute = Vec_IntArray(*(Vec_Int_t **)&pCex[4].nRegs);
  n_00 = Extra_TransferPermute(pDVar1,ddDestination,n,Permute);
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(*(DdManager **)&pCex[1].iFrame,n);
  pDVar5 = Cudd_bddIntersect(*(DdManager **)(pCex + 2),n_00,pDVar5);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(*(DdManager **)(pCex + 2),n_00);
  iVar2 = Cudd_bddPickOneCube(*(DdManager **)(pCex + 2),pDVar5,string);
  Cudd_RecursiveDeref(*(DdManager **)(pCex + 2),pDVar5);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0xa5,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  iVar2 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs);
  pValues._0_4_ = (int)pValues - iVar2;
  for (RetValue = 0; iVar2 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs), RetValue < iVar2;
      RetValue = RetValue + 1) {
    vSupps = (Vec_Ptr_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)&pCex->nRegs + 0x10),RetValue);
    iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs);
    if (string[iVar2 + RetValue] == '\x01') {
      Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),(int)pValues + RetValue);
    }
  }
  if (nPiOffset != 0) {
    bImage = Llb_CoreComputeCube(*(DdManager **)&pCex[1].iFrame,*(Vec_Int_t **)(pCex + 4),1,string);
    Cudd_Ref(bImage);
    goto LAB_00ab3f03;
  }
  for (RetValue = 0; iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs), RetValue < iVar2;
      RetValue = RetValue + 1) {
    p_00 = *(Vec_Ptr_t **)(*(long *)&pCex->nRegs + 0x10);
    iVar2 = Saig_ManPiNum(*(Aig_Man_t **)&pCex->nRegs);
    vSupps = (Vec_Ptr_t *)Vec_PtrEntry(p_00,RetValue + iVar2);
    if (string[RetValue] != '\0') {
      __assert_fail("pValues[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                    ,0xb1,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
    }
  }
LAB_00ab42d9:
  iVar2 = Saig_ManRegNum(*(Aig_Man_t **)&pCex->nRegs);
  if ((int)pValues != iVar2) {
    __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0xb8,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  iVar2 = Saig_ManFindFailedPoCex(*(Aig_Man_t **)pCex,(Abc_Cex_t *)pObj);
  if ((-1 < iVar2) && (iVar3 = Saig_ManPoNum(*(Aig_Man_t **)pCex), iVar2 < iVar3)) {
    (pObj->field_0).CioId = iVar2;
    if (string != (char *)0x0) {
      free(string);
    }
    Vec_VecFree((Vec_Vec_t *)vQuant1);
    Vec_VecFree((Vec_Vec_t *)bState);
    return (Abc_Cex_t *)pObj;
  }
  __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                ,0xbb,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
}

Assistant:

Abc_Cex_t * Llb_CoreDeriveCex( Llb_Img_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

    // get supports and quantified variables
    Vec_PtrReverseOrder( p->vDdMans );
    vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 1, 0 );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, 0 );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Llb_ImgQuantifyReset( p->vDdMans );
//    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0 );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
        // compute the next states
        bImage = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bState, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 1, 0, 0 );
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage ); printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );

        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
    RetValue = Saig_ManFindFailedPoCex( p->pInit, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return pCex;
}